

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void __thiscall
CLI::Range::Range<double>(Range *this,double min_val,double max_val,string *validator_name)

{
  ulong uVar1;
  char *pcVar2;
  ostream *poVar3;
  anon_class_16_2_ee34707b local_210;
  string local_200;
  stringstream local_1e0 [8];
  stringstream out;
  ostream local_1d0 [392];
  string local_48;
  string *local_28;
  string *validator_name_local;
  double max_val_local;
  double min_val_local;
  Range *this_local;
  
  local_28 = validator_name;
  validator_name_local = (string *)max_val;
  max_val_local = min_val;
  min_val_local = (double)this;
  ::std::__cxx11::string::string((string *)&local_48,(string *)validator_name);
  Validator::Validator(&this->super_Validator,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    ::std::__cxx11::stringstream::stringstream(local_1e0);
    pcVar2 = detail::type_name<double,_(CLI::detail::enabler)0>();
    poVar3 = ::std::operator<<(local_1d0,pcVar2);
    poVar3 = ::std::operator<<(poVar3," in [");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,max_val_local);
    poVar3 = ::std::operator<<(poVar3," - ");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,(double)validator_name_local);
    ::std::operator<<(poVar3,"]");
    ::std::__cxx11::stringstream::str();
    Validator::description(&this->super_Validator,&local_200);
    ::std::__cxx11::string::~string((string *)&local_200);
    ::std::__cxx11::stringstream::~stringstream(local_1e0);
  }
  local_210.min_val = max_val_local;
  local_210.max_val = (double)validator_name_local;
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,&local_210);
  return;
}

Assistant:

Range(T min_val, T max_val, const std::string &validator_name = std::string{}) : Validator(validator_name) {
        if(validator_name.empty()) {
            std::stringstream out;
            out << detail::type_name<T>() << " in [" << min_val << " - " << max_val << "]";
            description(out.str());
        }

        func_ = [min_val, max_val](std::string &input) {
            using CLI::detail::lexical_cast;
            T val;
            bool converted = lexical_cast(input, val);
            if((!converted) || (val < min_val || val > max_val)) {
                std::stringstream out;
                out << "Value " << input << " not in range [";
                out << min_val << " - " << max_val << "]";
                return out.str();
            }
            return std::string{};
        };
    }